

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O2

void __thiscall FlatNode::addElement(FlatNode *this,QString *filepath,VCFilterFile *allInfo)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_QString_&> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (filepath->d).d;
  local_48.ptr = (filepath->d).ptr;
  local_48.size = (filepath->d).size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar4 = pathIndex(this,filepath);
  if (iVar4 != -1) {
    QString::mid((longlong)&local_68,(longlong)filepath);
    qVar3 = local_48.size;
    pcVar2 = local_48.ptr;
    pDVar1 = local_48.d;
    local_48.d = local_68.d;
    local_48.ptr = local_68.ptr;
    local_68.d = pDVar1;
    local_68.ptr = pcVar2;
    local_48.size = local_68.size;
    local_68.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  local_80.b = &allInfo->file;
  local_80.a.b = (char (*) [2])0x222025;
  local_80.a.a = (QString *)&local_48;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_QString_&>::convertTo<QString>
            ((QString *)&local_68,&local_80);
  QMap<QString,_VCFilterFile>::insert(&this->children,(QString *)&local_68,allInfo);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addElement(const QString &filepath, const VCFilterFile &allInfo) override {
        QString newKey(filepath);

        int index = pathIndex(filepath);
        if (index != -1)
            newKey = filepath.mid(index+1);

        // Key designed to sort files with same
        // name in different paths correctly
        children.insert(newKey + "\0" + allInfo.file, allInfo);
    }